

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O1

SUNNonlinearSolver SUNNonlinSol_Newton(N_Vector y)

{
  _generic_N_Vector_Ops *p_Var1;
  SUNNonlinearSolver __ptr;
  _generic_SUNNonlinearSolver_Ops *__ptr_00;
  undefined8 *puVar2;
  N_Vector p_Var3;
  
  if ((((y != (N_Vector)0x0) && (p_Var1 = y->ops, p_Var1->nvclone != (_func_N_Vector_N_Vector *)0x0)
       ) && (p_Var1->nvdestroy != (_func_void_N_Vector *)0x0)) &&
     (((p_Var1->nvscale != (_func_void_realtype_N_Vector_N_Vector *)0x0 &&
       (p_Var1->nvlinearsum != (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0)) &&
      (__ptr = (SUNNonlinearSolver)malloc(0x10), __ptr != (SUNNonlinearSolver)0x0)))) {
    __ptr_00 = (_generic_SUNNonlinearSolver_Ops *)malloc(0x68);
    if (__ptr_00 != (_generic_SUNNonlinearSolver_Ops *)0x0) {
      __ptr_00->gettype = SUNNonlinSolGetType_Newton;
      __ptr_00->initialize = SUNNonlinSolInitialize_Newton;
      __ptr_00->setup = (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0;
      __ptr_00->solve = SUNNonlinSolSolve_Newton;
      __ptr_00->free = SUNNonlinSolFree_Newton;
      __ptr_00->setsysfn = SUNNonlinSolSetSysFn_Newton;
      __ptr_00->setlsetupfn = SUNNonlinSolSetLSetupFn_Newton;
      __ptr_00->setlsolvefn = SUNNonlinSolSetLSolveFn_Newton;
      __ptr_00->setctestfn = SUNNonlinSolSetConvTestFn_Newton;
      __ptr_00->setmaxiters = SUNNonlinSolSetMaxIters_Newton;
      __ptr_00->getnumiters = SUNNonlinSolGetNumIters_Newton;
      __ptr_00->getcuriter = SUNNonlinSolGetCurIter_Newton;
      __ptr_00->getnumconvfails = SUNNonlinSolGetNumConvFails_Newton;
      puVar2 = (undefined8 *)malloc(0x48);
      if (puVar2 != (undefined8 *)0x0) {
        puVar2[6] = 0;
        puVar2[7] = 0;
        puVar2[4] = 0;
        puVar2[5] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[8] = 0;
        p_Var3 = N_VClone(y);
        puVar2[4] = p_Var3;
        puVar2[5] = 0;
        *(undefined4 *)(puVar2 + 6) = 3;
        puVar2[7] = 0;
        puVar2[8] = 0;
        if (p_Var3 != (N_Vector)0x0) {
          __ptr->content = puVar2;
          __ptr->ops = __ptr_00;
          return __ptr;
        }
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (SUNNonlinearSolver)0x0;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_Newton(N_Vector y)
{
  SUNNonlinearSolver NLS;
  SUNNonlinearSolver_Ops ops;
  SUNNonlinearSolverContent_Newton content;

  /* Check that the supplied N_Vector is non-NULL */
  if (y == NULL) return(NULL);

  /* Check that the supplied N_Vector supports all required operations */
  if ( (y->ops->nvclone     == NULL) ||
       (y->ops->nvdestroy   == NULL) ||
       (y->ops->nvscale     == NULL) ||
       (y->ops->nvlinearsum == NULL) )
    return(NULL);

  /* Create nonlinear linear solver */
  NLS = NULL;
  NLS = (SUNNonlinearSolver) malloc(sizeof *NLS);
  if (NLS == NULL) return(NULL);

  /* Create linear solver operation structure */
  ops = NULL;
  ops = (SUNNonlinearSolver_Ops) malloc(sizeof *ops);
  if (ops == NULL) { free(NLS); return(NULL); }

  /* Attach operations */
  ops->gettype         = SUNNonlinSolGetType_Newton;
  ops->initialize      = SUNNonlinSolInitialize_Newton;
  ops->setup           = NULL; /* no setup needed */
  ops->solve           = SUNNonlinSolSolve_Newton;
  ops->free            = SUNNonlinSolFree_Newton;
  ops->setsysfn        = SUNNonlinSolSetSysFn_Newton;
  ops->setlsetupfn     = SUNNonlinSolSetLSetupFn_Newton;
  ops->setlsolvefn     = SUNNonlinSolSetLSolveFn_Newton;
  ops->setctestfn      = SUNNonlinSolSetConvTestFn_Newton;
  ops->setmaxiters     = SUNNonlinSolSetMaxIters_Newton;
  ops->getnumiters     = SUNNonlinSolGetNumIters_Newton;
  ops->getcuriter      = SUNNonlinSolGetCurIter_Newton;
  ops->getnumconvfails = SUNNonlinSolGetNumConvFails_Newton;

  /* Create content */
  content = NULL;
  content = (SUNNonlinearSolverContent_Newton) malloc(sizeof *content);
  if (content == NULL) { free(ops); free(NLS); return(NULL); }

  /* Initialize all components of content to 0/NULL */
  memset(content, 0, sizeof(struct _SUNNonlinearSolverContent_Newton));

  /* Fill content */
  content->Sys        = NULL;
  content->LSetup     = NULL;
  content->LSolve     = NULL;
  content->CTest      = NULL;
  content->delta      = N_VClone(y);
  content->jcur       = SUNFALSE;
  content->curiter    = 0;
  content->maxiters   = 3;
  content->niters     = 0;
  content->nconvfails = 0;

  /* check if clone was successful */
  if (content->delta == NULL) { free(ops); free(NLS); return(NULL); }

  /* Attach content and ops */
  NLS->content = content;
  NLS->ops     = ops;

  return(NLS);
}